

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConvolutionLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  uint64_t uVar1;
  uint64_t outChannels;
  undefined8 uVar2;
  bool bVar3;
  ConvolutionPaddingTypeCase CVar4;
  int iVar5;
  ConvolutionLayerParams *this_00;
  string *psVar6;
  uint64 uVar7;
  WeightParams *pWVar8;
  RepeatedField<float> *pRVar9;
  ulong uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80;
  undefined1 local_b60 [79];
  allocator local_b11;
  string local_b10;
  undefined1 local_ae8 [32];
  undefined1 local_ac8 [80];
  undefined1 local_a78 [32];
  undefined1 local_a58 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  string local_998;
  uint64_t bias_size;
  undefined1 local_950 [79];
  allocator local_901;
  string local_900;
  undefined1 local_8d8 [32];
  undefined1 local_8b8 [80];
  undefined1 local_868 [32];
  undefined1 local_848 [32];
  undefined1 local_828 [32];
  undefined1 local_808 [32];
  undefined1 local_7e8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  undefined1 local_668 [8];
  string err_7;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  string local_420;
  uint64_t weight_size;
  uint64_t expected_weight_size;
  undefined1 local_3d0 [72];
  undefined1 local_388 [72];
  string local_340;
  WeightParamType biasValueType;
  WeightParamType weightsValueType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string local_2d0;
  uint64 uStack_2a8;
  bool has_bias;
  uint64_t kernelWidth;
  uint64_t kernelHeight;
  uint64_t nGroups;
  uint64_t outputChannels;
  uint64_t kernelChannels;
  undefined1 local_260 [8];
  string err_3;
  string local_220;
  ConvolutionLayerParams *pCStack_1f8;
  bool is_deconv;
  ConvolutionLayerParams *params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  string err_1;
  undefined1 local_168 [8];
  string err;
  Result local_120;
  undefined1 local_f0 [32];
  undefined1 local_d0 [40];
  Result local_a8;
  undefined1 local_70 [48];
  Result_conflict r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r._32_8_ = layer;
  Result::Result((Result *)(local_70 + 0x28));
  validateInputCount((Result_conflict *)local_70,(NeuralNetworkLayer *)r._32_8_,1,2);
  Result::operator=((Result *)(local_70 + 0x28),(Result *)local_70);
  Result::~Result((Result *)local_70);
  bVar3 = Result::good((Result *)(local_70 + 0x28));
  if (bVar3) {
    validateOutputCount((Result_conflict *)(local_d0 + 0x28),(NeuralNetworkLayer *)r._32_8_,1,1);
    Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_d0 + 0x28));
    Result::~Result((Result *)(local_d0 + 0x28));
    bVar3 = Result::good((Result *)(local_70 + 0x28));
    uVar2 = r._32_8_;
    if (bVar3) {
      if ((this->ndArrayInterpretation & 1U) == 0) {
        iVar5 = Specification::NeuralNetworkLayer::input_size((NeuralNetworkLayer *)r._32_8_);
        if (iVar5 != 1) {
          psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                             ((NeuralNetworkLayer *)r._32_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &err_1.super__Rb_tree_node_base._M_right,"Convolution Layer \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar6
                        );
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_168,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &err_1.super__Rb_tree_node_base._M_right,
                         "\' does not support weight as input tensor when RANK5_ARRAY_MAPPING == true."
                        );
          std::__cxx11::string::~string((string *)&err_1.super__Rb_tree_node_base._M_right);
          Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                         (string *)local_168);
          local_a8.m_message._M_storage._M_storage[0] = '\x01';
          local_a8.m_message._M_storage._M_storage[1] = '\0';
          local_a8.m_message._M_storage._M_storage[2] = '\0';
          local_a8.m_message._M_storage._M_storage[3] = '\0';
          std::__cxx11::string::~string((string *)local_168);
          goto LAB_003f5d4b;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_f0,"Convolution",
                   (allocator *)((long)local_120.m_message._M_storage._M_storage + 7));
        validateInputOutputRankEquality
                  ((Result_conflict *)local_d0,(NeuralNetworkLayer *)uVar2,(string *)local_f0,
                   &this->blobNameToRank);
        Result::operator=((Result *)(local_70 + 0x28),(Result *)local_d0);
        Result::~Result((Result *)local_d0);
        std::__cxx11::string::~string((string *)local_f0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)local_120.m_message._M_storage._M_storage + 7));
        bVar3 = Result::good((Result *)(local_70 + 0x28));
        uVar2 = r._32_8_;
        if (!bVar3) {
          Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
          local_a8.m_message._M_storage._M_storage[0] = '\x01';
          local_a8.m_message._M_storage._M_storage[1] = '\0';
          local_a8.m_message._M_storage._M_storage[2] = '\0';
          local_a8.m_message._M_storage._M_storage[3] = '\0';
          goto LAB_003f5d4b;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&err._M_storage,"Convolution",
                   (allocator *)((long)&err.super__Rb_tree_node_base._M_right + 7));
        validateRankCount((Result_conflict *)&local_120,(NeuralNetworkLayer *)uVar2,
                          (string *)&err._M_storage,4,-1,&this->blobNameToRank);
        Result::operator=((Result *)(local_70 + 0x28),&local_120);
        Result::~Result(&local_120);
        std::__cxx11::string::~string((string *)&err._M_storage);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)&err.super__Rb_tree_node_base._M_right + 7));
        bVar3 = Result::good((Result *)(local_70 + 0x28));
        if (!bVar3) {
          Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
          local_a8.m_message._M_storage._M_storage[0] = '\x01';
          local_a8.m_message._M_storage._M_storage[1] = '\0';
          local_a8.m_message._M_storage._M_storage[2] = '\0';
          local_a8.m_message._M_storage._M_storage[3] = '\0';
          goto LAB_003f5d4b;
        }
      }
      this_00 = Specification::NeuralNetworkLayer::convolution((NeuralNetworkLayer *)r._32_8_);
      CVar4 = Specification::ConvolutionLayerParams::ConvolutionPaddingType_case(this_00);
      if (CVar4 == CONVOLUTIONPADDINGTYPE_NOT_SET) {
        psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
        std::operator+(&local_1c8,"Padding type for convolution layer \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar6);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,&local_1c8,"\' is not set.");
        std::__cxx11::string::~string((string *)&local_1c8);
        Result::Result((Result *)&params,INVALID_MODEL_PARAMETERS,(string *)local_1a8);
        Result::operator=((Result *)(local_70 + 0x28),(Result *)&params);
        Result::~Result((Result *)&params);
        Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
        local_a8.m_message._M_storage._M_storage[0] = '\x01';
        local_a8.m_message._M_storage._M_storage[1] = '\0';
        local_a8.m_message._M_storage._M_storage[2] = '\0';
        local_a8.m_message._M_storage._M_storage[3] = '\0';
        std::__cxx11::string::~string((string *)local_1a8);
      }
      else {
        pCStack_1f8 = Specification::NeuralNetworkLayer::convolution((NeuralNetworkLayer *)r._32_8_)
        ;
        local_220._M_storage._M_storage[7] =
             Specification::ConvolutionLayerParams::isdeconvolution(pCStack_1f8);
        if (((bool)local_220._M_storage._M_storage[7]) &&
           (iVar5 = Specification::NeuralNetworkLayer::input_size((NeuralNetworkLayer *)r._32_8_),
           iVar5 != 1)) {
          psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                             ((NeuralNetworkLayer *)r._32_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &err_3.super__Rb_tree_node_base._M_right,"Deconvolution Layer \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar6
                        );
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_220,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &err_3.super__Rb_tree_node_base._M_right,
                         "\' does not support weight as input tensor.");
          std::__cxx11::string::~string((string *)&err_3.super__Rb_tree_node_base._M_right);
          Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_220);
          local_a8.m_message._M_storage._M_storage[0] = '\x01';
          local_a8.m_message._M_storage._M_storage[1] = '\0';
          local_a8.m_message._M_storage._M_storage[2] = '\0';
          local_a8.m_message._M_storage._M_storage[3] = '\0';
          std::__cxx11::string::~string((string *)&local_220);
        }
        else {
          iVar5 = Specification::NeuralNetworkLayer::input_size((NeuralNetworkLayer *)r._32_8_);
          if ((iVar5 == 1) ||
             (((iVar5 = Specification::ConvolutionLayerParams::dilationfactor_size(pCStack_1f8),
               iVar5 < 1 ||
               (uVar7 = Specification::ConvolutionLayerParams::dilationfactor(pCStack_1f8,0),
               uVar7 < 2)) &&
              ((iVar5 = Specification::ConvolutionLayerParams::dilationfactor_size(pCStack_1f8),
               iVar5 < 2 ||
               (uVar7 = Specification::ConvolutionLayerParams::dilationfactor(pCStack_1f8,1),
               uVar7 < 2)))))) {
            outputChannels = Specification::ConvolutionLayerParams::kernelchannels(pCStack_1f8);
            nGroups = Specification::ConvolutionLayerParams::outputchannels(pCStack_1f8);
            kernelHeight = Specification::ConvolutionLayerParams::ngroups(pCStack_1f8);
            if (kernelHeight == 0) {
              kernelHeight = 1;
            }
            iVar5 = Specification::ConvolutionLayerParams::kernelsize_size(pCStack_1f8);
            if (iVar5 < 1) {
              kernelWidth = 3;
            }
            else {
              kernelWidth = Specification::ConvolutionLayerParams::kernelsize(pCStack_1f8,0);
            }
            iVar5 = Specification::ConvolutionLayerParams::kernelsize_size(pCStack_1f8);
            if (iVar5 < 2) {
              uStack_2a8 = 3;
            }
            else {
              uStack_2a8 = Specification::ConvolutionLayerParams::kernelsize(pCStack_1f8,1);
            }
            iVar5 = Specification::NeuralNetworkLayer::input_size((NeuralNetworkLayer *)r._32_8_);
            if (iVar5 < 2) {
              local_2d0._M_storage._M_storage[7] =
                   Specification::ConvolutionLayerParams::hasbias(pCStack_1f8);
              if (((bool)local_2d0._M_storage._M_storage[7]) &&
                 (iVar5 = Specification::NeuralNetworkLayer::input_size
                                    ((NeuralNetworkLayer *)r._32_8_), iVar5 != 1)) {
                psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                   ((NeuralNetworkLayer *)r._32_8_);
                std::operator+(&local_2f0,"Convolution layer: \'",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar6);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_2d0,&local_2f0,
                               "\' with dynamic weight does not support static bias.");
                std::__cxx11::string::~string((string *)&local_2f0);
                Result::Result((Result *)&biasValueType,INVALID_MODEL_PARAMETERS,&local_2d0);
                Result::operator=((Result *)(local_70 + 0x28),(Result *)&biasValueType);
                Result::~Result((Result *)&biasValueType);
                std::__cxx11::string::~string((string *)&local_2d0);
              }
              pWVar8 = Specification::ConvolutionLayerParams::weights(pCStack_1f8);
              local_340._M_storage._M_storage._4_4_ = valueType(pWVar8);
              pWVar8 = Specification::ConvolutionLayerParams::bias(pCStack_1f8);
              local_340._M_storage._M_storage._0_4_ = valueType(pWVar8);
              if ((local_340._M_storage._M_storage._4_4_ == UNSPECIFIED) ||
                 (((local_2d0._M_storage._M_storage[7] & 1) != 0 &&
                  (local_340._M_storage._M_storage._0_4_ == UNSPECIFIED)))) {
                psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                   ((NeuralNetworkLayer *)r._32_8_);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_388 + 0x28),"Convolution layer \'",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar6);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_340,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_388 + 0x28),"\'  has invalid weights/bias fields.");
                std::__cxx11::string::~string((string *)(local_388 + 0x28));
                Result::Result((Result *)local_388,INVALID_MODEL_PARAMETERS,&local_340);
                Result::operator=((Result *)(local_70 + 0x28),(Result *)local_388);
                Result::~Result((Result *)local_388);
                Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
                local_a8.m_message._M_storage._M_storage[0] = '\x01';
                local_a8.m_message._M_storage._M_storage[1] = '\0';
                local_a8.m_message._M_storage._M_storage[2] = '\0';
                local_a8.m_message._M_storage._M_storage[3] = '\0';
                std::__cxx11::string::~string((string *)&local_340);
              }
              else if (((local_2d0._M_storage._M_storage[7] & 1) == 0) ||
                      (((local_340._M_storage._M_storage._4_4_ != FLOAT16 ||
                        (local_340._M_storage._M_storage._0_4_ != FLOAT32)) &&
                       ((local_340._M_storage._M_storage._4_4_ != FLOAT32 ||
                        (local_340._M_storage._M_storage._0_4_ != FLOAT16)))))) {
                uVar10 = nGroups;
                if ((local_220._M_storage._M_storage[7] & 1) != 0) {
                  uVar10 = nGroups / kernelHeight;
                }
                weight_size = outputChannels * uVar10 * kernelWidth * uStack_2a8;
                local_420._M_storage._M_storage[0] = '\0';
                local_420._M_storage._M_storage[1] = '\0';
                local_420._M_storage._M_storage[2] = '\0';
                local_420._M_storage._M_storage[3] = '\0';
                local_420._M_storage._M_storage[4] = '\0';
                local_420._M_storage._M_storage[5] = '\0';
                local_420._M_storage._M_storage[6] = '\0';
                local_420._M_storage._M_storage[7] = '\0';
                if ((local_340._M_storage._M_storage._4_4_ == FLOAT32) ||
                   (local_340._M_storage._M_storage._4_4_ == FLOAT16)) {
                  if (local_340._M_storage._M_storage._4_4_ == FLOAT32) {
                    pWVar8 = Specification::ConvolutionLayerParams::weights(pCStack_1f8);
                    pRVar9 = Specification::WeightParams::floatvalue(pWVar8);
                    iVar5 = google::protobuf::RepeatedField<float>::size(pRVar9);
                    local_420._M_storage._M_storage = (uchar  [8])(long)iVar5;
                  }
                  else {
                    pWVar8 = Specification::ConvolutionLayerParams::weights(pCStack_1f8);
                    Specification::WeightParams::float16value_abi_cxx11_(pWVar8);
                    uVar10 = std::__cxx11::string::size();
                    local_420._M_storage._M_storage = (uchar  [8])(uVar10 >> 1);
                  }
                  if (local_420._M_storage._M_storage != (uchar  [8])weight_size) {
                    if ((local_220._M_storage._M_storage[7] & 1) == 0) {
                      psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                         ((NeuralNetworkLayer *)r._32_8_);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(local_7e8 + 0x20),"Convolution layer \'",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)psVar6);
                      std::operator+(&local_7a8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(local_7e8 + 0x20),"\' has weight matrix of size ");
                      std::__cxx11::to_string
                                ((string *)local_7e8,(unsigned_long)local_420._M_storage._M_storage)
                      ;
                      std::operator+(&local_788,&local_7a8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_7e8);
                      std::operator+(&local_768,&local_788," to encode a ");
                      std::__cxx11::to_string((string *)local_808,nGroups);
                      std::operator+(&local_748,&local_768,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_808);
                      std::operator+(&local_728,&local_748,anon_var_dwarf_23898b);
                      std::__cxx11::to_string((string *)local_828,outputChannels);
                      std::operator+(&local_708,&local_728,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_828);
                      std::operator+(&local_6e8,&local_708,anon_var_dwarf_23898b);
                      std::__cxx11::to_string((string *)local_848,kernelWidth);
                      std::operator+(&local_6c8,&local_6e8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_848);
                      std::operator+(&local_6a8,&local_6c8,anon_var_dwarf_23898b);
                      std::__cxx11::to_string((string *)local_868,uStack_2a8);
                      std::operator+(&local_688,&local_6a8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_868);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_668,&local_688," convolution.");
                      std::__cxx11::string::~string((string *)&local_688);
                      std::__cxx11::string::~string((string *)local_868);
                      std::__cxx11::string::~string((string *)&local_6a8);
                      std::__cxx11::string::~string((string *)&local_6c8);
                      std::__cxx11::string::~string((string *)local_848);
                      std::__cxx11::string::~string((string *)&local_6e8);
                      std::__cxx11::string::~string((string *)&local_708);
                      std::__cxx11::string::~string((string *)local_828);
                      std::__cxx11::string::~string((string *)&local_728);
                      std::__cxx11::string::~string((string *)&local_748);
                      std::__cxx11::string::~string((string *)local_808);
                      std::__cxx11::string::~string((string *)&local_768);
                      std::__cxx11::string::~string((string *)&local_788);
                      std::__cxx11::string::~string((string *)local_7e8);
                      std::__cxx11::string::~string((string *)&local_7a8);
                      std::__cxx11::string::~string((string *)(local_7e8 + 0x20));
                      Result::Result((Result *)(local_8b8 + 0x28),INVALID_MODEL_PARAMETERS,
                                     (string *)local_668);
                      Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_8b8 + 0x28));
                      Result::~Result((Result *)(local_8b8 + 0x28));
                      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
                      local_a8.m_message._M_storage._M_storage[0] = '\x01';
                      local_a8.m_message._M_storage._M_storage[1] = '\0';
                      local_a8.m_message._M_storage._M_storage[2] = '\0';
                      local_a8.m_message._M_storage._M_storage[3] = '\0';
                      std::__cxx11::string::~string((string *)local_668);
                    }
                    else {
                      psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                         ((NeuralNetworkLayer *)r._32_8_);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(local_5a0 + 0x20),"Deconvolution layer \'",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)psVar6);
                      std::operator+(&local_560,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(local_5a0 + 0x20),"\' has weight matrix of size ");
                      std::__cxx11::to_string
                                ((string *)local_5a0,(unsigned_long)local_420._M_storage._M_storage)
                      ;
                      std::operator+(&local_540,&local_560,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_5a0);
                      std::operator+(&local_520,&local_540," to encode a ");
                      std::__cxx11::to_string((string *)local_5c0,outputChannels);
                      std::operator+(&local_500,&local_520,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_5c0);
                      std::operator+(&local_4e0,&local_500,anon_var_dwarf_23898b);
                      std::__cxx11::to_string((string *)local_5e0,nGroups / kernelHeight);
                      std::operator+(&local_4c0,&local_4e0,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_5e0);
                      std::operator+(&local_4a0,&local_4c0,anon_var_dwarf_23898b);
                      std::__cxx11::to_string((string *)local_600,kernelWidth);
                      std::operator+(&local_480,&local_4a0,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_600);
                      std::operator+(&local_460,&local_480,anon_var_dwarf_23898b);
                      std::__cxx11::to_string((string *)local_620,uStack_2a8);
                      std::operator+(&local_440,&local_460,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_620);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&local_420,&local_440," convolution.");
                      std::__cxx11::string::~string((string *)&local_440);
                      std::__cxx11::string::~string((string *)local_620);
                      std::__cxx11::string::~string((string *)&local_460);
                      std::__cxx11::string::~string((string *)&local_480);
                      std::__cxx11::string::~string((string *)local_600);
                      std::__cxx11::string::~string((string *)&local_4a0);
                      std::__cxx11::string::~string((string *)&local_4c0);
                      std::__cxx11::string::~string((string *)local_5e0);
                      std::__cxx11::string::~string((string *)&local_4e0);
                      std::__cxx11::string::~string((string *)&local_500);
                      std::__cxx11::string::~string((string *)local_5c0);
                      std::__cxx11::string::~string((string *)&local_520);
                      std::__cxx11::string::~string((string *)&local_540);
                      std::__cxx11::string::~string((string *)local_5a0);
                      std::__cxx11::string::~string((string *)&local_560);
                      std::__cxx11::string::~string((string *)(local_5a0 + 0x20));
                      Result::Result((Result *)&err_7.super__Rb_tree_node_base._M_right,
                                     INVALID_MODEL_PARAMETERS,&local_420);
                      Result::operator=((Result *)(local_70 + 0x28),
                                        (Result *)&err_7.super__Rb_tree_node_base._M_right);
                      Result::~Result((Result *)&err_7.super__Rb_tree_node_base._M_right);
                      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
                      local_a8.m_message._M_storage._M_storage[0] = '\x01';
                      local_a8.m_message._M_storage._M_storage[1] = '\0';
                      local_a8.m_message._M_storage._M_storage[2] = '\0';
                      local_a8.m_message._M_storage._M_storage[3] = '\0';
                      std::__cxx11::string::~string((string *)&local_420);
                    }
                    goto LAB_003f5d4b;
                  }
                }
                else {
                  if (local_340._M_storage._M_storage._4_4_ != QUINT) {
                    psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                       ((NeuralNetworkLayer *)r._32_8_);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&bias_size,"Layer ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)psVar6);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_950,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&bias_size,"has not specified weights.");
                    Result::Result((Result *)(local_950 + 0x20),INVALID_MODEL_PARAMETERS,
                                   (string *)local_950);
                    Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_950 + 0x20));
                    Result::~Result((Result *)(local_950 + 0x20));
                    std::__cxx11::string::~string((string *)local_950);
                    std::__cxx11::string::~string((string *)&bias_size);
                    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
                    local_a8.m_message._M_storage._M_storage[0] = '\x01';
                    local_a8.m_message._M_storage._M_storage[1] = '\0';
                    local_a8.m_message._M_storage._M_storage[2] = '\0';
                    local_a8.m_message._M_storage._M_storage[3] = '\0';
                    goto LAB_003f5d4b;
                  }
                  pWVar8 = Specification::ConvolutionLayerParams::weights(pCStack_1f8);
                  outChannels = nGroups;
                  uVar1 = weight_size;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)local_8d8,"Convolution",
                             (allocator *)(local_900._M_storage._M_storage + 7));
                  psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                     ((NeuralNetworkLayer *)r._32_8_);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_900,"weight",&local_901);
                  validateGeneralWeightParams
                            ((Result_conflict *)local_8b8,pWVar8,uVar1,outChannels,
                             (string *)local_8d8,psVar6,&local_900);
                  Result::operator=((Result *)(local_70 + 0x28),(Result *)local_8b8);
                  Result::~Result((Result *)local_8b8);
                  std::__cxx11::string::~string((string *)&local_900);
                  std::allocator<char>::~allocator((allocator<char> *)&local_901);
                  std::__cxx11::string::~string((string *)local_8d8);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)(local_900._M_storage._M_storage + 7));
                  bVar3 = Result::good((Result *)(local_70 + 0x28));
                  if (!bVar3) {
                    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
                    local_a8.m_message._M_storage._M_storage[0] = '\x01';
                    local_a8.m_message._M_storage._M_storage[1] = '\0';
                    local_a8.m_message._M_storage._M_storage[2] = '\0';
                    local_a8.m_message._M_storage._M_storage[3] = '\0';
                    goto LAB_003f5d4b;
                  }
                }
                local_998._M_storage._M_storage[0] = '\0';
                local_998._M_storage._M_storage[1] = '\0';
                local_998._M_storage._M_storage[2] = '\0';
                local_998._M_storage._M_storage[3] = '\0';
                local_998._M_storage._M_storage[4] = '\0';
                local_998._M_storage._M_storage[5] = '\0';
                local_998._M_storage._M_storage[6] = '\0';
                local_998._M_storage._M_storage[7] = '\0';
                if ((local_2d0._M_storage._M_storage[7] & 1) != 0) {
                  if ((local_340._M_storage._M_storage._0_4_ == FLOAT32) ||
                     (local_340._M_storage._M_storage._0_4_ == FLOAT16)) {
                    if (local_340._M_storage._M_storage._0_4_ == FLOAT32) {
                      pWVar8 = Specification::ConvolutionLayerParams::bias(pCStack_1f8);
                      pRVar9 = Specification::WeightParams::floatvalue(pWVar8);
                      iVar5 = google::protobuf::RepeatedField<float>::size(pRVar9);
                      local_998._M_storage._M_storage = (uchar  [8])(long)iVar5;
                    }
                    else {
                      pWVar8 = Specification::ConvolutionLayerParams::bias(pCStack_1f8);
                      Specification::WeightParams::float16value_abi_cxx11_(pWVar8);
                      uVar10 = std::__cxx11::string::size();
                      local_998._M_storage._M_storage = (uchar  [8])(uVar10 >> 1);
                    }
                    if (local_998._M_storage._M_storage != (uchar  [8])nGroups) {
                      psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                         ((NeuralNetworkLayer *)r._32_8_);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(local_a58 + 0x20),"Convolution layer \'",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)psVar6);
                      std::operator+(&local_a18,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(local_a58 + 0x20),"\' has a bias vector of size ");
                      std::__cxx11::to_string
                                ((string *)local_a58,(unsigned_long)local_998._M_storage._M_storage)
                      ;
                      std::operator+(&local_9f8,&local_a18,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_a58);
                      std::operator+(&local_9d8,&local_9f8," but should be ");
                      std::__cxx11::to_string((string *)local_a78,nGroups);
                      std::operator+(&local_9b8,&local_9d8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_a78);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&local_998,&local_9b8,".");
                      std::__cxx11::string::~string((string *)&local_9b8);
                      std::__cxx11::string::~string((string *)local_a78);
                      std::__cxx11::string::~string((string *)&local_9d8);
                      std::__cxx11::string::~string((string *)&local_9f8);
                      std::__cxx11::string::~string((string *)local_a58);
                      std::__cxx11::string::~string((string *)&local_a18);
                      std::__cxx11::string::~string((string *)(local_a58 + 0x20));
                      Result::Result((Result *)(local_ac8 + 0x28),INVALID_MODEL_PARAMETERS,
                                     &local_998);
                      Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_ac8 + 0x28));
                      Result::~Result((Result *)(local_ac8 + 0x28));
                      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
                      local_a8.m_message._M_storage._M_storage[0] = '\x01';
                      local_a8.m_message._M_storage._M_storage[1] = '\0';
                      local_a8.m_message._M_storage._M_storage[2] = '\0';
                      local_a8.m_message._M_storage._M_storage[3] = '\0';
                      std::__cxx11::string::~string((string *)&local_998);
                      goto LAB_003f5d4b;
                    }
                  }
                  else {
                    if (local_340._M_storage._M_storage._0_4_ != QUINT) {
                      psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                         ((NeuralNetworkLayer *)r._32_8_);
                      std::operator+(&local_b80,"Layer ",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)psVar6);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_b60,&local_b80,"has not specified bias.");
                      Result::Result((Result *)(local_b60 + 0x20),INVALID_MODEL_PARAMETERS,
                                     (string *)local_b60);
                      Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_b60 + 0x20));
                      Result::~Result((Result *)(local_b60 + 0x20));
                      std::__cxx11::string::~string((string *)local_b60);
                      std::__cxx11::string::~string((string *)&local_b80);
                      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
                      local_a8.m_message._M_storage._M_storage[0] = '\x01';
                      local_a8.m_message._M_storage._M_storage[1] = '\0';
                      local_a8.m_message._M_storage._M_storage[2] = '\0';
                      local_a8.m_message._M_storage._M_storage[3] = '\0';
                      goto LAB_003f5d4b;
                    }
                    pWVar8 = Specification::ConvolutionLayerParams::bias(pCStack_1f8);
                    uVar1 = nGroups;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)local_ae8,"Convolution",
                               (allocator *)(local_b10._M_storage._M_storage + 7));
                    psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                       ((NeuralNetworkLayer *)r._32_8_);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_b10,"bias",&local_b11);
                    validateGeneralWeightParams
                              ((Result_conflict *)local_ac8,pWVar8,uVar1,1,(string *)local_ae8,
                               psVar6,&local_b10);
                    Result::operator=((Result *)(local_70 + 0x28),(Result *)local_ac8);
                    Result::~Result((Result *)local_ac8);
                    std::__cxx11::string::~string((string *)&local_b10);
                    std::allocator<char>::~allocator((allocator<char> *)&local_b11);
                    std::__cxx11::string::~string((string *)local_ae8);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)(local_b10._M_storage._M_storage + 7));
                    bVar3 = Result::good((Result *)(local_70 + 0x28));
                    if (!bVar3) {
                      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
                      local_a8.m_message._M_storage._M_storage[0] = '\x01';
                      local_a8.m_message._M_storage._M_storage[1] = '\0';
                      local_a8.m_message._M_storage._M_storage[2] = '\0';
                      local_a8.m_message._M_storage._M_storage[3] = '\0';
                      goto LAB_003f5d4b;
                    }
                  }
                }
                Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
                local_a8.m_message._M_storage._M_storage[0] = '\x01';
                local_a8.m_message._M_storage._M_storage[1] = '\0';
                local_a8.m_message._M_storage._M_storage[2] = '\0';
                local_a8.m_message._M_storage._M_storage[3] = '\0';
              }
              else {
                psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                   ((NeuralNetworkLayer *)r._32_8_);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &expected_weight_size,"Convolution layer ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar6);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_3d0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &expected_weight_size,
                               "has unmatched precisions of weights/bias They should either be half or full precision."
                              );
                Result::Result((Result *)(local_3d0 + 0x20),INVALID_MODEL_PARAMETERS,
                               (string *)local_3d0);
                Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_3d0 + 0x20));
                Result::~Result((Result *)(local_3d0 + 0x20));
                std::__cxx11::string::~string((string *)local_3d0);
                std::__cxx11::string::~string((string *)&expected_weight_size);
                Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
                local_a8.m_message._M_storage._M_storage[0] = '\x01';
                local_a8.m_message._M_storage._M_storage[1] = '\0';
                local_a8.m_message._M_storage._M_storage[2] = '\0';
                local_a8.m_message._M_storage._M_storage[3] = '\0';
              }
            }
            else {
              Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
              local_a8.m_message._M_storage._M_storage[0] = '\x01';
              local_a8.m_message._M_storage._M_storage[1] = '\0';
              local_a8.m_message._M_storage._M_storage[2] = '\0';
              local_a8.m_message._M_storage._M_storage[3] = '\0';
            }
          }
          else {
            psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                               ((NeuralNetworkLayer *)r._32_8_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &kernelChannels,"Convolution layer: \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar6);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_260,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &kernelChannels,
                           "\' , dilated convolution does not support weight as input tensor.");
            std::__cxx11::string::~string((string *)&kernelChannels);
            Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                           (string *)local_260);
            local_a8.m_message._M_storage._M_storage[0] = '\x01';
            local_a8.m_message._M_storage._M_storage[1] = '\0';
            local_a8.m_message._M_storage._M_storage[2] = '\0';
            local_a8.m_message._M_storage._M_storage[3] = '\0';
            std::__cxx11::string::~string((string *)local_260);
          }
        }
      }
    }
    else {
      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
      local_a8.m_message._M_storage._M_storage[0] = '\x01';
      local_a8.m_message._M_storage._M_storage[1] = '\0';
      local_a8.m_message._M_storage._M_storage[2] = '\0';
      local_a8.m_message._M_storage._M_storage[3] = '\0';
    }
  }
  else {
    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
    local_a8.m_message._M_storage._M_storage[0] = '\x01';
    local_a8.m_message._M_storage._M_storage[1] = '\0';
    local_a8.m_message._M_storage._M_storage[2] = '\0';
    local_a8.m_message._M_storage._M_storage[3] = '\0';
  }
LAB_003f5d4b:
  Result::~Result((Result *)(local_70 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConvolutionLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    r = validateInputCount(layer, 1, 2);
    if (!r.good()) {return r;}

    r = validateOutputCount(layer, 1, 1);
    if (!r.good()) {return r;}

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Convolution", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Convolution", 4, -1, blobNameToRank);
        if (!r.good()) {return r;}
    } else {
        if (layer.input_size() != 1) {
            std::string err = "Convolution Layer '" + layer.name() +
            "' does not support weight as input tensor when RANK5_ARRAY_MAPPING == true.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    // We need to check if the ConvolutionPaddingType is set
    if (layer.convolution().ConvolutionPaddingType_case() == Specification::ConvolutionLayerParams::ConvolutionPaddingTypeCase::CONVOLUTIONPADDINGTYPE_NOT_SET) {
        std::string err = "Padding type for convolution layer '" + layer.name() + "' is not set.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    const auto& params = layer.convolution();
    bool is_deconv = params.isdeconvolution();
    if (is_deconv && layer.input_size() != 1) {
        std::string err = "Deconvolution Layer '" + layer.name() + "' does not support weight as input tensor.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.input_size() != 1 && (
        ((params.dilationfactor_size() > 0 && params.dilationfactor(0) > 1) ||
        (params.dilationfactor_size() > 1 && params.dilationfactor(1) > 1))
        )) {
        std::string err = "Convolution layer: '" + layer.name() + "' , dilated convolution does not support weight as input tensor.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    uint64_t kernelChannels = params.kernelchannels();
    uint64_t outputChannels = params.outputchannels();
    uint64_t nGroups = params.ngroups();
    if (nGroups == 0) {
        // default value specified in protobuf
        nGroups = 1;
    }
    uint64_t kernelHeight;
    if (params.kernelsize_size() > 0) {
        kernelHeight = params.kernelsize(0);
    }
    else {
        // this is the default specified in the protobuf file
        kernelHeight = 3;
    }
    uint64_t kernelWidth;
    if (params.kernelsize_size() > 1) {
        kernelWidth = params.kernelsize(1);
    }
    else {
        kernelWidth = 3;
    }

    if (layer.input_size() > 1) {
        return r;
    }

    bool has_bias = params.hasbias();
    if (has_bias && layer.input_size() != 1) {
        std::string err = "Convolution layer: '" + layer.name() + "' with dynamic weight does not support static bias.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    WeightParamType weightsValueType, biasValueType;
    weightsValueType = valueType(params.weights());
    biasValueType = valueType(params.bias());

    // Check weight/bias value types. Only float32 or float16 parameters can be populated at any time
    if ( (weightsValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)) {
        std::string err = "Convolution layer '" + layer.name() + "'  has invalid weights/bias fields.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    if (has_bias){
        if ((weightsValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (weightsValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)){
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Convolution layer " + layer.name() +
                       "has unmatched precisions of weights/bias They should either be half or full precision.");
            return r;
        }
    }

    // Get populated weight and bias sizes
    // Check weights
    uint64_t expected_weight_size = 0;
    // conv: outputChannels, kernelChannels, kernelHeight, kernelWidth
    // deconv: kernelChannels, outputChannels / nGroups, kernelHeight, kernelWidth
    if (is_deconv) {
        expected_weight_size = kernelChannels * (outputChannels / nGroups) * kernelHeight * kernelWidth;
    }
    else {
        expected_weight_size = outputChannels * kernelChannels * kernelHeight * kernelWidth;
    }
    uint64_t weight_size = 0;
    if (weightsValueType == FLOAT32 || weightsValueType == FLOAT16) {
        if (weightsValueType == FLOAT32) {
            weight_size = static_cast<uint64_t>(params.weights().floatvalue().size());
        } else {
            weight_size = static_cast<uint64_t>(params.weights().float16value().size() / 2);
        }
        if (weight_size != expected_weight_size) {
            if (is_deconv) {
                std::string err = "Deconvolution layer '" + layer.name() + "' has weight matrix of size " + std::to_string(weight_size) + " to encode a " + std::to_string(kernelChannels) + " × " + std::to_string(outputChannels/nGroups) + " × " + std::to_string(kernelHeight) + " × " + std::to_string(kernelWidth) + " convolution.";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
            else {
                std::string err = "Convolution layer '" + layer.name() + "' has weight matrix of size " + std::to_string(weight_size) + " to encode a " + std::to_string(outputChannels) + " × " + std::to_string(kernelChannels) + " × " + std::to_string(kernelHeight) + " × " + std::to_string(kernelWidth) + " convolution.";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
        }
    } // if (weightsValueType == FLOAT32 || weightsValueType == FLOAT16)
    else if (weightsValueType == QUINT) {
        r = validateGeneralWeightParams(params.weights(), expected_weight_size, outputChannels, "Convolution", layer.name(), "weight");
        if (!r.good()) return r;
    } else { // EMPTY
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer " + layer.name() + "has not specified weights.");
        return r;
    }

    // Check the bias
    uint64_t bias_size = 0;
    if (has_bias) {
        if (biasValueType == FLOAT32 || biasValueType == FLOAT16){
            if (biasValueType == FLOAT32){
                bias_size = static_cast<uint64_t>(params.bias().floatvalue().size());
            } else {
                bias_size = static_cast<uint64_t>(params.bias().float16value().size() / 2);
            }
            if (bias_size != outputChannels) {
                std::string err = "Convolution layer '" + layer.name() + "' has a bias vector of size " +
                std::to_string(bias_size) + " but should be " + std::to_string(outputChannels) + ".";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
        } else if (biasValueType == QUINT){
            // quantization of bias vector should be 1
            r = validateGeneralWeightParams(params.bias(), outputChannels, 1, "Convolution", layer.name(), "bias");
            if (!r.good()) return r;
        } else { // EMPTY
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer " + layer.name() + "has not specified bias.");
            return r;
        }
    }
    return r;
}